

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

void __thiscall ANN::fit(ANN *this,MatrixXd *X,MatrixXd *y)

{
  Layer *pLVar1;
  double *__ptr;
  LhsNested pMVar2;
  RhsNested pMVar3;
  undefined8 uVar4;
  ulong uVar5;
  MatrixXd predicted;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_90;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  MatrixXd local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)X);
  predict(&local_60,this,(MatrixXd *)&local_48);
  free(local_48.m_data);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            (&local_90,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)y,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_60);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_90);
  Eigen::internal::
  inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8);
  uVar5 = (ulong)((long)(this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  while( true ) {
    uVar5 = uVar5 - 1;
    if ((int)(uint)uVar5 < 1) break;
    pLVar1 = (this->layers).super__Vector_base<Layer_*,_std::allocator<Layer_*>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)uVar5 & 0x7fffffff];
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_78,&local_a8);
    (*pLVar1->_vptr_Layer[1])(&local_90,pLVar1,&local_78);
    uVar4 = local_90._16_8_;
    pMVar3 = local_90.m_rhs;
    pMVar2 = local_90.m_lhs;
    __ptr = local_a8.m_data;
    local_90.m_lhs = (LhsNested)local_a8.m_data;
    local_a8.m_data = (double *)pMVar2;
    local_90.m_rhs = (RhsNested)local_a8.m_rows;
    local_90._16_8_ = local_a8.m_cols;
    local_a8.m_rows = (Index)pMVar3;
    local_a8.m_cols = uVar4;
    free(__ptr);
    free(local_78.m_data);
  }
  free(local_a8.m_data);
  free(local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void ANN::fit(Eigen::MatrixXd X, Eigen::MatrixXd y) {
    // Calculate feed forward for X
    Eigen::MatrixXd predicted = predict(X);
    // Calculate error for output
    Eigen::MatrixXd error = y - predicted;
    error.transposeInPlace();
    // Backpropagate error
    for(int i = layers.size()-1; i > 0; i--) {
        error = layers[i]->backward(error);
    }
}